

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * cmTargetPropertyComputer::ComputeLocation<cmTarget>(cmTarget *tgt,string *config)

{
  cmGeneratorTarget *this;
  bool bVar1;
  int iVar2;
  string *name;
  string local_70;
  cmGeneratorTarget *local_50;
  cmGeneratorTarget *gt;
  cmGlobalGenerator *gg;
  string *local_20;
  string *config_local;
  cmTarget *tgt_local;
  
  local_20 = config;
  config_local = (string *)tgt;
  if (ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::loc_abi_cxx11_ == '\0'
     ) {
    iVar2 = __cxa_guard_acquire(&ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)
                                 ::loc_abi_cxx11_);
    if (iVar2 != 0) {
      std::__cxx11::string::string
                ((string *)
                 &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                  loc_abi_cxx11_);
      __cxa_atexit(std::__cxx11::string::~string,
                   &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                    loc_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                           loc_abi_cxx11_);
    }
  }
  bVar1 = cmTarget::IsImported((cmTarget *)config_local);
  if (bVar1) {
    cmTarget::ImportedGetFullPath
              ((string *)&gg,(cmTarget *)config_local,local_20,RuntimeBinaryArtifact);
    std::__cxx11::string::operator=
              ((string *)
               &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                loc_abi_cxx11_,(string *)&gg);
    std::__cxx11::string::~string((string *)&gg);
  }
  else {
    gt = (cmGeneratorTarget *)cmTarget::GetGlobalGenerator((cmTarget *)config_local);
    bVar1 = cmGlobalGenerator::GetConfigureDoneCMP0026((cmGlobalGenerator *)gt);
    if (!bVar1) {
      cmGlobalGenerator::CreateGenerationObjects((cmGlobalGenerator *)gt,AllTargets);
    }
    this = gt;
    name = cmTarget::GetName_abi_cxx11_((cmTarget *)config_local);
    local_50 = cmGlobalGenerator::FindGeneratorTarget((cmGlobalGenerator *)this,name);
    cmGeneratorTarget::GetFullPath(&local_70,local_50,local_20,RuntimeBinaryArtifact,false);
    std::__cxx11::string::operator=
              ((string *)
               &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::
                loc_abi_cxx11_,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return &ComputeLocation<cmTarget>(cmTarget_const*,std::__cxx11::string_const&)::loc_abi_cxx11_;
}

Assistant:

const std::string& cmTargetPropertyComputer::ComputeLocation<cmTarget>(
  cmTarget const* tgt, const std::string& config)
{
  static std::string loc;
  if (tgt->IsImported()) {
    loc =
      tgt->ImportedGetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
    return loc;
  }

  cmGlobalGenerator* gg = tgt->GetGlobalGenerator();
  if (!gg->GetConfigureDoneCMP0026()) {
    gg->CreateGenerationObjects();
  }
  cmGeneratorTarget* gt = gg->FindGeneratorTarget(tgt->GetName());
  loc = gt->GetFullPath(config, cmStateEnums::RuntimeBinaryArtifact);
  return loc;
}